

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k053260.c
# Opt level: O0

void device_reset_k053260(void *chip)

{
  int local_1c;
  int i;
  k053260_state *info;
  void *chip_local;
  
  memset((void *)((long)chip + 8),0,4);
  *(undefined1 *)((long)chip + 0xc) = 0;
  *(undefined1 *)((long)chip + 0xd) = 0;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    KDSC_voice_reset((KDSC_Voice *)((long)chip + (long)local_1c * 0x28 + 0x10));
  }
  RC_RESET((RATIO_CNTR *)((long)chip + 0xc0));
  return;
}

Assistant:

static void device_reset_k053260(void* chip)
{
	k053260_state *info = (k053260_state *)chip;
	int i;

	memset(info->portdata, 0, sizeof(info->portdata));

	info->keyon = 0;
	info->mode = 0;

	for (i = 0; i < 4; i++)
		KDSC_voice_reset(&info->voice[i]);

	RC_RESET(&info->cycleCntr);

	return;
}